

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData160 * __thiscall
cfd::core::HashUtil::Output160(ByteData160 *__return_storage_ptr__,HashUtil *this)

{
  CfdException *this_00;
  allocator local_79;
  string local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  HashUtil *local_18;
  HashUtil *this_local;
  
  local_18 = this;
  this_local = (HashUtil *)__return_storage_ptr__;
  if (this->hash_type_ == '\x01') {
    ByteData::GetBytes(&local_30,&this->buffer_);
    Ripemd160(__return_storage_ptr__,&local_30);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  }
  else {
    if (this->hash_type_ != '\x02') {
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_78,"unknown hash type.",&local_79);
      CfdException::CfdException(this_00,kCfdInternalError,&local_78);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::GetBytes(&local_58,&this->buffer_);
    Hash160(__return_storage_ptr__,&local_58);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData160 HashUtil::Output160() {
  switch (hash_type_) {
    case kRipemd160:
      return Ripemd160(buffer_.GetBytes());
    case kHash160:
      return Hash160(buffer_.GetBytes());
    case kSha256:
      // fall-through
    case kSha256D:
      // fall-through
    case kSha512:
      // fall-through
    default:
      throw CfdException(kCfdInternalError, "unknown hash type.");
  }
}